

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeomVector3.cpp
# Opt level: O1

GeomVector3 * __thiscall
iDynTree::GeomVector3::compose(GeomVector3 *this,GeomVector3 *op1,GeomVector3 *op2)

{
  double dVar1;
  double dVar2;
  GeomVector3 *in_RDI;
  
  dVar1 = (op1->super_Vector3).m_data[1];
  dVar2 = (op2->super_Vector3).m_data[1];
  (in_RDI->super_Vector3).m_data[0] =
       (op2->super_Vector3).m_data[0] + (op1->super_Vector3).m_data[0];
  (in_RDI->super_Vector3).m_data[1] = dVar2 + dVar1;
  (in_RDI->super_Vector3).m_data[2] =
       (op1->super_Vector3).m_data[2] + (op2->super_Vector3).m_data[2];
  return in_RDI;
}

Assistant:

GeomVector3 GeomVector3::compose(const GeomVector3& op1, const GeomVector3& op2) const
    {
        GeomVector3 result;
        Eigen::Map<const Vector3d> op1Data(op1.data());
        Eigen::Map<const Vector3d> op2Data(op2.data());
        Eigen::Map<Vector3d> resultData(result.data());

        resultData = op1Data + op2Data;

        return result;
    }